

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O3

void capnp::_::PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_capnp::Text::Reader> value)

{
  Reader *pRVar1;
  ulong uVar2;
  Reader *pRVar3;
  Reader *__begin0;
  Builder l;
  PointerBuilder local_68;
  ListBuilder local_48;
  
  pRVar3 = value.ptr;
  local_68.pointer = builder.pointer;
  local_68.segment = builder.segment;
  local_68.capTable = builder.capTable;
  PointerBuilder::initList(&local_48,&local_68,POINTER,(ElementCount)value.size_);
  if (value.size_ != 0) {
    pRVar1 = pRVar3 + value.size_;
    uVar2 = 0;
    do {
      local_68.pointer = (WirePointer *)(local_48.ptr + (local_48.step * uVar2 >> 3));
      uVar2 = (ulong)((int)uVar2 + 1);
      local_68.segment = local_48.segment;
      local_68.capTable = local_48.capTable;
      PointerBuilder::setBlob<capnp::Text>(&local_68,(Reader)(pRVar3->super_StringPtr).content);
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != pRVar1);
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }